

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::GetIn6Addr(CNetAddr *this,in6_addr *pipv6Addr)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_net == NET_CJDNS) || (this->m_net == NET_IPV6)) {
    uVar1 = (this->m_addr)._size;
    uVar5 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar5 = uVar1;
    }
    if (uVar5 != 0x10) {
      __assert_fail("sizeof(*pipv6Addr) == m_addr.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                    ,0x28b,"bool CNetAddr::GetIn6Addr(struct in6_addr *) const");
    }
    if (0x10 < uVar1) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    uVar3 = *(undefined8 *)((long)&(this->m_addr)._union + 8);
    *(char **)&pipv6Addr->__in6_u = (this->m_addr)._union.indirect_contents.indirect;
    *(undefined8 *)((long)&pipv6Addr->__in6_u + 8) = uVar3;
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::GetIn6Addr(struct in6_addr* pipv6Addr) const
{
    if (!IsIPv6() && !IsCJDNS()) {
        return false;
    }
    assert(sizeof(*pipv6Addr) == m_addr.size());
    memcpy(pipv6Addr, m_addr.data(), m_addr.size());
    return true;
}